

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O3

TestLog * deqp::gles2::Functional::DepthStencilCaseUtil::operator<<
                    (TestLog *log,StencilParams *params)

{
  ostringstream *this;
  Enum<int,_2UL> local_1e8;
  Hex<8UL> local_1d8;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  this = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  func = ",9);
  local_1b0.m_value = params->function;
  local_1b0.m_getName = glu::getCompareFuncName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  ref = ",8);
  std::ostream::operator<<(this,params->reference);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  compare mask = ",0x11);
  local_1e8.m_getName = (GetNameFunc)(ulong)params->compareMask;
  tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_1e8,(ostream *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  stencil fail = ",0x11);
  local_1e8.m_value = params->stencilFailOp;
  local_1e8.m_getName = glu::getStencilOpName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  depth fail = ",0xf);
  local_1c0.m_value = params->depthFailOp;
  local_1c0.m_getName = glu::getStencilOpName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  depth pass = ",0xf);
  local_1d0.m_value = params->depthPassOp;
  local_1d0.m_getName = glu::getStencilOpName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  write mask = ",0xf);
  local_1d8.value = (deUint64)params->writeMask;
  tcu::Format::Hex<8UL>::toStream(&local_1d8,(ostream *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_128);
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const StencilParams& params)
{
	log << TestLog::Message << "  func = " << glu::getCompareFuncStr(params.function) << "\n"
							<< "  ref = " << params.reference << "\n"
							<< "  compare mask = " << tcu::toHex(params.compareMask) << "\n"
							<< "  stencil fail = " << glu::getStencilOpStr(params.stencilFailOp) << "\n"
							<< "  depth fail = " << glu::getStencilOpStr(params.depthFailOp) << "\n"
							<< "  depth pass = " << glu::getStencilOpStr(params.depthPassOp) << "\n"
							<< "  write mask = " << tcu::toHex(params.writeMask) << "\n"
		<< TestLog::EndMessage;
	return log;
}